

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labeling_lee_2021_brts_no_zeroinit.h
# Opt level: O1

double __thiscall BRTS_XZ<UF>::Alloc(BRTS_XZ<UF> *this)

{
  double dVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  Mat1b *pMVar5;
  int *piVar6;
  Mat1i *pMVar7;
  long lVar8;
  uint64_t *puVar9;
  Run *pRVar10;
  int iVar11;
  int iVar12;
  ulong uVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  Mat local_70 [96];
  
  pMVar5 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
  iVar2 = *(int *)&pMVar5->field_0x8;
  iVar12 = *(int *)&pMVar5->field_0xc;
  dVar14 = UF::Alloc(((iVar12 - (iVar12 + 1 >> 0x1f)) + 1 >> 1) *
                     ((iVar2 - (iVar2 + 1 >> 0x1f)) + 1 >> 1) + 1,
                     &(this->super_Labeling2D<(Connectivity2D)8,_false>).super_Labeling.perf_);
  lVar8 = cv::getTickCount();
  (this->super_Labeling2D<(Connectivity2D)8,_false>).super_Labeling.perf_.counter_.last =
       (double)lVar8;
  piVar6 = *(int **)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0x40;
  cv::Mat::Mat(local_70,*piVar6,piVar6[1],4);
  cv::Mat::operator=(&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->super_Mat,
                     local_70);
  cv::Mat::~Mat(local_70);
  pMVar5 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
  iVar2 = *(int *)&pMVar5->field_0x8;
  iVar12 = *(int *)&pMVar5->field_0xc;
  (this->data_compressed).height = iVar2;
  (this->data_compressed).width = iVar12;
  iVar11 = iVar12 + 0x3f;
  if (-1 < iVar12) {
    iVar11 = iVar12;
  }
  iVar12 = (iVar11 >> 6) + 1;
  (this->data_compressed).data_width = iVar12;
  iVar12 = iVar12 * iVar2;
  uVar13 = 0xffffffffffffffff;
  if (-1 < iVar12) {
    uVar13 = (long)iVar12 * 8;
  }
  puVar9 = (uint64_t *)operator_new__(uVar13);
  (this->data_compressed).bits = puVar9;
  pMVar7 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_;
  memset(*(void **)&pMVar7->field_0x10,0,*(long *)&pMVar7->field_0x20 - *(long *)&pMVar7->field_0x18
        );
  memset((this->data_compressed).bits,0,
         (long)(this->data_compressed).data_width * (long)(this->data_compressed).height * 8);
  lVar8 = cv::getTickCount();
  dVar16 = (double)lVar8 -
           (this->super_Labeling2D<(Connectivity2D)8,_false>).super_Labeling.perf_.counter_.last;
  (this->super_Labeling2D<(Connectivity2D)8,_false>).super_Labeling.perf_.counter_.last = dVar16;
  (this->super_Labeling2D<(Connectivity2D)8,_false>).super_Labeling.perf_.counter_.total =
       (this->super_Labeling2D<(Connectivity2D)8,_false>).super_Labeling.perf_.counter_.total +
       dVar16;
  dVar1 = (this->super_Labeling2D<(Connectivity2D)8,_false>).super_Labeling.perf_.tick_frequency_;
  pMVar5 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
  uVar3 = *(uint *)&pMVar5->field_0x8;
  uVar4 = *(uint *)&pMVar5->field_0xc;
  (this->data_runs).height = uVar3;
  (this->data_runs).width = uVar4;
  pRVar10 = (Run *)operator_new__((ulong)(((uVar4 >> 1) + 2) * uVar3 + 1) << 3);
  (this->data_runs).runs = pRVar10;
  lVar8 = cv::getTickCount();
  (this->super_Labeling2D<(Connectivity2D)8,_false>).super_Labeling.perf_.counter_.last =
       (double)lVar8;
  pMVar7 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_;
  memset(*(void **)&pMVar7->field_0x10,0,*(long *)&pMVar7->field_0x20 - *(long *)&pMVar7->field_0x18
        );
  memset((this->data_compressed).bits,0,
         (long)(this->data_compressed).data_width * (long)(this->data_compressed).height * 8);
  lVar8 = cv::getTickCount();
  dVar15 = (double)lVar8 -
           (this->super_Labeling2D<(Connectivity2D)8,_false>).super_Labeling.perf_.counter_.last;
  (this->super_Labeling2D<(Connectivity2D)8,_false>).super_Labeling.perf_.counter_.last = dVar15;
  (this->super_Labeling2D<(Connectivity2D)8,_false>).super_Labeling.perf_.counter_.total =
       (this->super_Labeling2D<(Connectivity2D)8,_false>).super_Labeling.perf_.counter_.total +
       dVar15;
  return dVar14 + ((dVar16 * 1000.0) / dVar1 -
                  (dVar15 * 1000.0) /
                  (this->super_Labeling2D<(Connectivity2D)8,_false>).super_Labeling.perf_.
                  tick_frequency_);
}

Assistant:

double Alloc() {
        // Memory allocation of the labels solver
        double ls_t = LabelsSolver::Alloc(UPPER_BOUND_8_CONNECTIVITY, perf_);

        // Memory allocation for others
        perf_.start();
        img_labels_ = cv::Mat1i(img_.size());
        data_compressed.Alloc(img_.rows, img_.cols);
        memset(img_labels_.data, 0, img_labels_.dataend - img_labels_.datastart);
        memset(data_compressed.bits, 0, data_compressed.height * data_compressed.data_width * sizeof(uint64_t));
        perf_.stop();
        double t = perf_.last();

        // Run metadata allocation time will be calculated later
        data_runs.Alloc(img_.rows, img_.cols);

        perf_.start();
        memset(img_labels_.data, 0, img_labels_.dataend - img_labels_.datastart);
        memset(data_compressed.bits, 0, data_compressed.height * data_compressed.data_width * sizeof(uint64_t));
        perf_.stop();
        double ma_t = t - perf_.last();

        // Return total time
        return ls_t + ma_t;
    }